

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,OffsetData *offset_data,uchar *head,
              size_t size,string *err)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  EXRChannelInfo *pEVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  TEXRImage *pTVar9;
  uchar **ppuVar10;
  size_t channel_offset_list_00;
  long lVar11;
  byte bVar12;
  unsigned_long uVar13;
  ulong uVar14;
  int *piVar15;
  EXRImage *pEVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int b;
  ulong uVar20;
  int iVar21;
  int iVar22;
  bool bVar23;
  bool bVar24;
  EXRChannelInfo *in_stack_fffffffffffffda8;
  undefined1 *local_228;
  undefined1 local_218 [16];
  ulong local_208;
  ulong local_200;
  size_t local_1f8;
  uchar *local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar2 = exr_header->compression_type;
  iVar6 = 0x10;
  if ((iVar2 != 3) && (iVar2 != 0x80)) {
    if (iVar2 == 4) {
      iVar6 = 0x20;
    }
    else {
      iVar6 = 1;
    }
  }
  iVar2 = (exr_header->data_window).max_x;
  iVar21 = (exr_header->data_window).min_x;
  iVar5 = iVar2 - iVar21;
  if ((iVar2 < iVar21) ||
     (iVar2 = (exr_header->data_window).max_y, iVar21 = (exr_header->data_window).min_y,
     iVar17 = iVar2 - iVar21, iVar2 < iVar21)) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::string::append((char *)err);
    return -4;
  }
  uVar18 = iVar5 + 1;
  uVar1 = iVar17 + 1;
  local_208 = (ulong)uVar1;
  if (0x7fffff < iVar17 || 0x7fffff < iVar5) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"data_with or data_height too large. data_width: ",0x30);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"data_height = ",0xe);
    plVar8 = (long *)std::ostream::operator<<((ostream *)poVar7,uVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_228);
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
LAB_001cc9b6:
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    return -4;
  }
  iVar2 = exr_header->num_channels;
  local_200 = (ulong)uVar18;
  if ((exr_header->tiled != 0) &&
     ((0x800000 < exr_header->tile_size_x || (0x800000 < exr_header->tile_size_y)))) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"tile with or tile height too large. tile width: ",0x30);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,exr_header->tile_size_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"tile height = ",0xe);
    plVar8 = (long *)std::ostream::operator<<((ostream *)poVar7,exr_header->tile_size_y);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_228);
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
    goto LAB_001cc9b6;
  }
  uVar14 = (ulong)iVar2;
  plVar8 = *(long **)&(((offset_data->offsets).
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      )._M_impl;
  lVar11 = plVar8[1];
  lVar3 = *plVar8;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar4 = exr_header->channels;
  local_1f8 = size;
  local_1f0 = head;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&channel_offset_list,uVar14);
  if (iVar2 == 0) {
    iVar21 = 0;
  }
  else {
    piVar15 = &pEVar4->pixel_type;
    uVar13 = 0;
    iVar21 = 0;
    bVar23 = false;
    uVar20 = 1;
    do {
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar20 - 1] = uVar13;
      uVar19 = (ulong)(uint)*piVar15;
      if (2 < uVar19) break;
      iVar21 = iVar21 + *(int *)(&DAT_00257198 + uVar19 * 4);
      uVar13 = uVar13 + *(long *)(&DAT_002571a8 + uVar19 * 8);
      bVar23 = uVar14 <= uVar20;
      piVar15 = piVar15 + 0x44;
      bVar24 = uVar20 != uVar14;
      uVar20 = uVar20 + 1;
    } while (bVar24);
    if (!bVar23) {
      iVar6 = -4;
      if (err != (string *)0x0) {
        std::__cxx11::string::append((char *)err);
      }
      goto LAB_001cd1a3;
    }
  }
  iVar5 = (int)local_200;
  if (exr_header->tiled == 0) {
    if (0xffffffc000000000 < (long)iVar5 * uVar14 * (long)(int)local_208 - 0x4000000000) {
      ppuVar10 = AllocateImage(iVar2,exr_header->channels,exr_header->requested_pixel_types,iVar5,
                               (int)local_208);
      exr_image->images = ppuVar10;
      uVar18 = (uint)((ulong)(lVar11 - lVar3) >> 3);
      if (0 < (int)uVar18) {
        channel_offset_list_00 = (size_t)iVar21;
        uVar20 = 0;
        uVar14 = local_1f8;
        bVar23 = false;
        do {
          lVar11 = *(long *)(*plVar8 + uVar20 * 8);
          bVar24 = true;
          if (lVar11 + 8U <= uVar14) {
            iVar21 = *(int *)(local_1f0 + lVar11 + 4);
            if ((ulong)(long)iVar21 <= uVar14 - (lVar11 + 8U)) {
              iVar5 = *(int *)(local_1f0 + lVar11);
              if (iVar21 != 0 && 0xffbffffe < iVar5 - 0x200001U) {
                iVar17 = (exr_header->data_window).max_y + 1;
                if (iVar5 + iVar6 <= iVar17) {
                  iVar17 = iVar5 + iVar6;
                }
                if (((iVar17 - iVar5 != 0 && iVar5 <= iVar17) &&
                    (iVar22 = (exr_header->data_window).min_y,
                    0xffffffff00000000 < ((long)iVar5 - (long)iVar22) - 0x80000000U)) &&
                   (iVar22 = iVar5 - iVar22, -1 < iVar22)) {
                  bVar24 = DecodePixelData(exr_image->images,exr_header->requested_pixel_types,
                                           local_1f0 + lVar11 + 8,(long)iVar21,
                                           exr_header->compression_type,exr_header->line_order,
                                           (int)local_200,(int)local_208,(int)local_200,(int)uVar20,
                                           iVar22,iVar17 - iVar5,channel_offset_list_00,
                                           (long)exr_header->num_channels,
                                           (EXRAttribute *)exr_header->channels,
                                           (size_t)&channel_offset_list,in_stack_fffffffffffffda8,
                                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           channel_offset_list_00);
                  bVar24 = (bool)(!bVar24 | bVar23);
                  uVar14 = local_1f8;
                }
              }
            }
          }
          uVar20 = uVar20 + 1;
          bVar23 = bVar24;
        } while ((uVar18 & 0x7fffffff) != uVar20);
        if (bVar24) {
          iVar6 = -4;
          if (err != (string *)0x0) {
            std::__cxx11::string::append((char *)err);
          }
          goto LAB_001cd1a3;
        }
      }
LAB_001cd164:
      if (0 < exr_header->num_channels) {
        lVar11 = 0;
        do {
          exr_header->pixel_types[lVar11] = exr_header->requested_pixel_types[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 < exr_header->num_channels);
      }
      exr_image->num_channels = iVar2;
      exr_image->width = (int)local_200;
      exr_image->height = (int)local_208;
      iVar6 = 0;
      goto LAB_001cd1a3;
    }
    iVar6 = -4;
    if (err == (string *)0x0) goto LAB_001cd1a3;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Image data size is zero or too large: width = ",0x2e);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", height = ",0xb);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", channels = ",0xd);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar2);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_228);
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
  }
  else if (exr_header->tile_size_x < 0) {
    iVar6 = -9;
    if (err == (string *)0x0) goto LAB_001cd1a3;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size x : ",0x16);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,exr_header->tile_size_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_228);
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
  }
  else {
    if (-1 < exr_header->tile_size_y) {
      if (exr_header->tile_level_mode == 2) {
        iVar6 = offset_data->num_y_levels;
        if (0 < iVar6) {
          iVar5 = offset_data->num_x_levels;
          iVar17 = 0;
          pTVar9 = (EXRImage *)0x0;
          do {
            if (0 < iVar5) {
              iVar22 = 0;
              pEVar16 = pTVar9;
              do {
                pTVar9 = exr_image;
                if (pEVar16 != (EXRImage *)0x0) {
                  pTVar9 = (TEXRImage *)operator_new(0x30);
                  pEVar16->next_level = pTVar9;
                  pTVar9->width = 0;
                  pTVar9->height = 0;
                  pTVar9->num_channels = 0;
                  pTVar9->num_tiles = 0;
                  pTVar9->level_x = 0;
                  pTVar9->level_y = 0;
                  pTVar9->images = (uchar **)0x0;
                  pTVar9->tiles = (EXRTile *)0x0;
                  pTVar9->next_level = (TEXRImage *)0x0;
                  pTVar9 = pEVar16->next_level;
                }
                iVar5 = (exr_header->data_window).max_x - (exr_header->data_window).min_x;
                iVar6 = (iVar5 + 1) / (1 << ((byte)iVar22 & 0x1f));
                iVar6 = (uint)(iVar6 << ((byte)iVar22 & 0x1f) <= iVar5 &&
                              exr_header->tile_rounding_mode == 1) + iVar6;
                if (iVar6 < 2) {
                  iVar6 = 1;
                }
                pTVar9->width = iVar6;
                iVar5 = (exr_header->data_window).max_y - (exr_header->data_window).min_y;
                iVar6 = (iVar5 + 1) / (1 << ((byte)iVar17 & 0x1f));
                iVar6 = (uint)(iVar6 << ((byte)iVar17 & 0x1f) <= iVar5 &&
                              exr_header->tile_rounding_mode == 1) + iVar6;
                if (iVar6 < 2) {
                  iVar6 = 1;
                }
                pTVar9->height = iVar6;
                pTVar9->level_x = iVar22;
                pTVar9->level_y = iVar17;
                iVar6 = DecodeTiledLevel(pTVar9,exr_header,offset_data,&channel_offset_list,iVar21,
                                         local_1f0,local_1f8,err);
                if (iVar6 != 0) goto LAB_001cd1a3;
                iVar22 = iVar22 + 1;
                iVar5 = offset_data->num_x_levels;
                pEVar16 = pTVar9;
              } while (iVar22 < iVar5);
              iVar6 = offset_data->num_y_levels;
            }
            iVar17 = iVar17 + 1;
          } while (iVar17 < iVar6);
        }
      }
      else if (0 < offset_data->num_x_levels) {
        iVar5 = 0;
        pEVar16 = (EXRImage *)0x0;
        do {
          pTVar9 = exr_image;
          if (pEVar16 != (EXRImage *)0x0) {
            pTVar9 = (TEXRImage *)operator_new(0x30);
            pEVar16->next_level = pTVar9;
            pTVar9->width = 0;
            pTVar9->height = 0;
            pTVar9->num_channels = 0;
            pTVar9->num_tiles = 0;
            pTVar9->level_x = 0;
            pTVar9->level_y = 0;
            pTVar9->images = (uchar **)0x0;
            pTVar9->tiles = (EXRTile *)0x0;
            pTVar9->next_level = (TEXRImage *)0x0;
            pTVar9 = pEVar16->next_level;
          }
          iVar22 = (exr_header->data_window).max_x - (exr_header->data_window).min_x;
          bVar12 = (byte)iVar5;
          iVar17 = 1 << (bVar12 & 0x1f);
          iVar6 = (iVar22 + 1) / iVar17;
          iVar6 = (uint)(iVar6 << (bVar12 & 0x1f) <= iVar22 && exr_header->tile_rounding_mode == 1)
                  + iVar6;
          if (iVar6 < 2) {
            iVar6 = 1;
          }
          pTVar9->width = iVar6;
          iVar6 = (exr_header->data_window).max_y - (exr_header->data_window).min_y;
          iVar17 = (iVar6 + 1) / iVar17;
          iVar17 = (uint)(iVar17 << (bVar12 & 0x1f) <= iVar6 && exr_header->tile_rounding_mode == 1)
                   + iVar17;
          if (iVar17 < 2) {
            iVar17 = 1;
          }
          pTVar9->height = iVar17;
          pTVar9->level_x = iVar5;
          pTVar9->level_y = iVar5;
          iVar6 = DecodeTiledLevel(pTVar9,exr_header,offset_data,&channel_offset_list,iVar21,
                                   local_1f0,local_1f8,err);
          if (iVar6 != 0) goto LAB_001cd1a3;
          iVar5 = iVar5 + 1;
          pEVar16 = pTVar9;
        } while (iVar5 < offset_data->num_x_levels);
      }
      goto LAB_001cd164;
    }
    iVar6 = -9;
    if (err == (string *)0x0) goto LAB_001cd1a3;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size y : ",0x16);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,exr_header->tile_size_y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_228);
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
LAB_001cd1a3:
  if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar6;
  }
  operator_delete(channel_offset_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return iVar6;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const OffsetData& offset_data,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;

#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param,
                                 exr_header->custom_attributes,
                                 int(exr_header->num_custom_attributes), err)) {
      return TINYEXR_ERROR_INVALID_HEADER;
    }
#endif
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_y < exr_header->data_window.min_y) {
    if (err) {
      (*err) += "Invalid data window.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    if ((data_width > TINYEXR_DIMENSION_THRESHOLD) || (data_height > TINYEXR_DIMENSION_THRESHOLD)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    if (exr_header->tiled) {
      if ((exr_header->tile_size_x > TINYEXR_DIMENSION_THRESHOLD) || (exr_header->tile_size_y > TINYEXR_DIMENSION_THRESHOLD)) {
        if (err) {
          std::stringstream ss;
          ss << "tile with or tile height too large. tile width: " << exr_header->tile_size_x
            << ", "
            << "tile height = " << exr_header->tile_size_y << std::endl;
          (*err) += ss.str();
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }
    }
  }

  const std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data.offsets[0][0];
  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<bool> invalid_data(false);
#else
  bool invalid_data(false);
#endif

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }
    if (exr_header->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) {
      EXRImage* level_image = NULL;
      for (int level = 0; level < offset_data.num_x_levels; ++level) {
        if (!level_image) {
          level_image = exr_image;
        } else {
          level_image->next_level = new EXRImage;
          InitEXRImage(level_image->next_level);
          level_image = level_image->next_level;
        }
        level_image->width =
          LevelSize(exr_header->data_window.max_x - exr_header->data_window.min_x + 1, level, exr_header->tile_rounding_mode);
        level_image->height =
          LevelSize(exr_header->data_window.max_y - exr_header->data_window.min_y + 1, level, exr_header->tile_rounding_mode);
        level_image->level_x = level;
        level_image->level_y = level;

        int ret = DecodeTiledLevel(level_image, exr_header,
          offset_data,
          channel_offset_list,
          pixel_data_size,
          head, size,
          err);
        if (ret != TINYEXR_SUCCESS) return ret;
      }
    } else {
      EXRImage* level_image = NULL;
      for (int level_y = 0; level_y < offset_data.num_y_levels; ++level_y)
        for (int level_x = 0; level_x < offset_data.num_x_levels; ++level_x) {
          if (!level_image) {
            level_image = exr_image;
          } else {
            level_image->next_level = new EXRImage;
            InitEXRImage(level_image->next_level);
            level_image = level_image->next_level;
          }

          level_image->width =
            LevelSize(exr_header->data_window.max_x - exr_header->data_window.min_x + 1, level_x, exr_header->tile_rounding_mode);
          level_image->height =
            LevelSize(exr_header->data_window.max_y - exr_header->data_window.min_y + 1, level_y, exr_header->tile_rounding_mode);
          level_image->level_x = level_x;
          level_image->level_y = level_y;

          int ret = DecodeTiledLevel(level_image, exr_header,
            offset_data,
            channel_offset_list,
            pixel_data_size,
            head, size,
            err);
          if (ret != TINYEXR_SUCCESS) return ret;
        }
    }
  } else {  // scanline format
    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(&line_no);
            tinyexr::swap4(&data_len);

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window.max_y + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window.min_y);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window.min_y;
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}